

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O2

void __thiscall btHashedSimplePairCache::btHashedSimplePairCache(btHashedSimplePairCache *this)

{
  this->_vptr_btHashedSimplePairCache = (_func_int **)&PTR__btHashedSimplePairCache_001ed9f8;
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = (btSimplePair *)0x0;
  (this->m_overlappingPairArray).m_size = 0;
  (this->m_overlappingPairArray).m_capacity = 0;
  (this->m_hashTable).m_ownsMemory = true;
  (this->m_hashTable).m_data = (int *)0x0;
  (this->m_hashTable).m_size = 0;
  (this->m_hashTable).m_capacity = 0;
  (this->m_next).m_ownsMemory = true;
  (this->m_next).m_data = (int *)0x0;
  (this->m_next).m_size = 0;
  (this->m_next).m_capacity = 0;
  btAlignedObjectArray<btSimplePair>::reserve(&this->m_overlappingPairArray,2);
  growTables(this);
  return;
}

Assistant:

btHashedSimplePairCache::btHashedSimplePairCache() {
	int initialAllocatedSize= 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
	growTables();
}